

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilksort-lace.c
# Opt level: O2

ELM * binsplit(ELM val,ELM *low,ELM *high)

{
  ulong uVar1;
  
  while (low != high) {
    uVar1 = ((long)high - (long)low >> 1) + 4U & 0xfffffffffffffff8;
    if (*(long *)((long)low + uVar1) < val) {
      low = (ELM *)((long)low + uVar1);
    }
    else {
      high = (ELM *)((long)low + (uVar1 - 8));
    }
  }
  return low + ((ulong)(*low <= val) - 1);
}

Assistant:

ELM *binsplit(ELM val, ELM *low, ELM *high)
{
    /*
     * returns index which contains greatest element <= val.  If val is
     * less than all elements, returns low-1
     */
    ELM *mid;

    while (low != high) {
        mid = low + ((high - low + 1) >> 1);
        if (val <= *mid)
            high = mid - 1;
        else
            low = mid;
    }

    if (*low > val)
        return low - 1;
    else
        return low;
}